

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall Lodtalk::AST::MessageSendNode::~MessageSendNode(MessageSendNode *this)

{
  bool bVar1;
  reference ppNVar2;
  Node **arg;
  iterator __end2;
  iterator __begin2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range2;
  MessageSendNode *this_local;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MessageSendNode_0020cb08;
  if (this->receiver != (Node *)0x0) {
    (*this->receiver->_vptr_Node[1])();
  }
  __end2 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::begin
                     (&this->arguments);
  arg = (Node **)std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::end
                           (&this->arguments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Lodtalk::AST::Node_**,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                                *)&arg);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<Lodtalk::AST::Node_**,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
              ::operator*(&__end2);
    if (*ppNVar2 != (Node *)0x0) {
      (*(*ppNVar2)->_vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<Lodtalk::AST::Node_**,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>::
  ~vector(&this->chainedMessages);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::~vector
            (&this->arguments);
  std::__cxx11::string::~string((string *)&this->selector);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

MessageSendNode::~MessageSendNode()
{
	delete receiver;
	for(auto &arg : arguments)
		delete arg;
}